

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O1

int EVP_PKEY_cmp(EVP_PKEY *a,EVP_PKEY *b)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  
  if (a->save_type != b->save_type) {
    return -1;
  }
  if (a->ameth == (EVP_PKEY_ASN1_METHOD *)0x0) {
    return -2;
  }
  pcVar1 = *(code **)(a->ameth + 0x98);
  if ((pcVar1 == (code *)0x0) || (iVar3 = (*pcVar1)(a,b), 0 < iVar3)) {
    if (*(code **)(a->ameth + 0x28) == (code *)0x0) {
      bVar2 = true;
      iVar3 = 0;
      goto LAB_0018a9be;
    }
    iVar3 = (**(code **)(a->ameth + 0x28))(a,b);
  }
  bVar2 = false;
LAB_0018a9be:
  if (bVar2) {
    return -2;
  }
  return iVar3;
}

Assistant:

int EVP_PKEY_cmp(const EVP_PKEY *a, const EVP_PKEY *b) {
  if (a->type != b->type) {
    return -1;
  }

  if (a->ameth) {
    int ret;
    // Compare parameters if the algorithm has them
    if (a->ameth->param_cmp) {
      ret = a->ameth->param_cmp(a, b);
      if (ret <= 0) {
        return ret;
      }
    }

    if (a->ameth->pub_cmp) {
      return a->ameth->pub_cmp(a, b);
    }
  }

  return -2;
}